

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O0

int __thiscall ncnn::GridSample::load_param(GridSample *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  int local_4;
  
  iVar1 = ParamDict::get(in_RSI,0,1);
  *(int *)(in_RDI + 0xd0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,1);
  *(int *)(in_RDI + 0xd4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,0);
  *(int *)(in_RDI + 0xd8) = iVar1;
  if ((*(int *)(in_RDI + 0xd0) < 1) || (3 < *(int *)(in_RDI + 0xd0))) {
    fprintf(_stderr,"unsupported sample type %d",(ulong)*(uint *)(in_RDI + 0xd0));
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  else if ((*(int *)(in_RDI + 0xd4) < 1) || (3 < *(int *)(in_RDI + 0xd4))) {
    fprintf(_stderr,"unsupported padding mode %d",(ulong)*(uint *)(in_RDI + 0xd4));
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int GridSample::load_param(const ParamDict& pd)
{
    sample_type = pd.get(0, 1);
    padding_mode = pd.get(1, 1);
    align_corner = pd.get(2, 0);

    if (sample_type < 1 || sample_type > 3)
    {
        NCNN_LOGE("unsupported sample type %d", sample_type);
        return -1;
    }

    if (padding_mode < 1 || padding_mode > 3)
    {
        NCNN_LOGE("unsupported padding mode %d", padding_mode);
        return -1;
    }

    return 0;
}